

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.hpp
# Opt level: O0

uint __thiscall rek::sample::AliasSampler::walkerSample(AliasSampler *this)

{
  uint uVar1;
  reference pvVar2;
  reference pvVar3;
  double dVar4;
  double r;
  uint i;
  AliasSampler *this_local;
  
  uVar1 = this->N;
  dVar4 = drand48();
  r._4_4_ = (int)(long)((double)(uVar1 - 1) * dVar4) + 1;
  dVar4 = drand48();
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->Y,(ulong)r._4_4_);
  if (*pvVar2 <= dVar4 && dVar4 != *pvVar2) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->A,(ulong)r._4_4_);
    r._4_4_ = *pvVar3;
  }
  return r._4_4_ - 1;
}

Assistant:

unsigned int walkerSample() {
    unsigned int i;
    double r;
    /* Let i = random uniform integer from {1,2,...N};  */
    i = 1 + (unsigned int)((N - 1) * drand48());
    r = drand48();
    if (r > Y[i]) i = A[i];

    return i - 1;
  }